

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcMapping.c
# Opt level: O2

sparc_hint Sparc_map_hint(char *name)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  
  sVar2 = strlen(name);
  lVar4 = 8;
  while( true ) {
    if (lVar4 == 0x38) {
      return SPARC_HINT_INVALID;
    }
    __s = *(char **)((long)&hint_maps[0].id + lVar4);
    sVar3 = strlen(__s);
    if ((sVar3 <= sVar2 && sVar2 - sVar3 != 0) &&
       (iVar1 = strcmp(__s,name + (sVar2 - sVar3)), iVar1 == 0)) break;
    lVar4 = lVar4 + 0x10;
  }
  return *(sparc_hint *)((long)&alias_fcc_maps[0xf].name + lVar4);
}

Assistant:

sparc_hint Sparc_map_hint(const char *name)
{
	size_t i, l1, l2;

	l1 = strlen(name);
	for(i = 0; i < ARR_SIZE(hint_maps); i++) {
		l2 = strlen(hint_maps[i].name);
		if (l1 > l2) {
			// compare the last part of @name with this hint string
			if (!strcmp(hint_maps[i].name, name + (l1 - l2)))
				return hint_maps[i].id;
		}
	}

	return SPARC_HINT_INVALID;
}